

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<6,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  Type in0;
  Vec4 *local_f0;
  ulong local_e8;
  float local_e0 [6];
  float local_c8 [4];
  float local_b8 [6];
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_94;
  undefined4 local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  Vector<float,_3> res_2;
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  
  pfVar1 = res_1.m_data + 2;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar7 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar6) = uVar7;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x40);
      lVar5 = lVar5 + 1;
      pfVar1 = pfVar1 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar5 != 4);
    stack0xffffffffffffffb8 = *(undefined8 *)evalCtx->in[0].m_data;
  }
  else {
    stack0xffffffffffffffb8 = 0;
    puVar4 = &s_constInMat4x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar1[lVar5] = *(float *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      lVar3 = lVar3 + 1;
      pfVar1 = pfVar1 + 1;
      puVar4 = puVar4 + 4;
    } while (lVar3 != 4);
  }
  puVar2 = &local_88;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  local_88 = 0;
  uStack_80 = 0;
  lVar3 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar3 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)puVar2 + lVar6) = uVar7;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x40);
    lVar5 = lVar5 + 1;
    puVar2 = (undefined8 *)((long)puVar2 + 4);
    lVar3 = lVar3 + 0x10;
  } while (lVar5 != 4);
  puVar2 = &local_88;
  pfVar1 = res_1.m_data + 2;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      *(float *)((long)puVar2 + lVar5) = pfVar1[lVar5];
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x10);
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + 2;
    pfVar1 = pfVar1 + 1;
  } while (lVar3 != 4);
  local_94 = local_88;
  local_8c = (undefined4)uStack_80;
  local_a0 = CONCAT44(res_2.m_data[2],res_2.m_data[1]);
  local_98 = 0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  lVar3 = 0;
  do {
    local_c8[lVar3] =
         *(float *)((long)&local_94 + lVar3 * 4) + *(float *)((long)&local_a0 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_b8[3] = 0.0;
  local_b8[4] = 0.0;
  local_b8[5] = 0.0;
  local_f0 = (Vec4 *)0x0;
  local_e8 = local_e8 & 0xffffffff00000000;
  lVar3 = 0;
  do {
    *(float *)((long)&local_f0 + lVar3 * 4) = local_c8[lVar3] + local_b8[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_b8[0] = res_1.m_data[1];
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  local_e0[2] = 0.0;
  local_e0[3] = 0.0;
  local_e0[4] = 0.0;
  lVar3 = 0;
  do {
    local_e0[lVar3 + 2] = *(float *)((long)&local_f0 + lVar3 * 4) + local_b8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_f0 = &evalCtx->color;
  local_e8 = 0x100000000;
  local_e0[0] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_f0 + lVar3 * 4)] = local_e0[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(transpose(in0));
	}